

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>
           *kernel)

{
  long start;
  DstXprType *pDVar1;
  PointerType pfVar2;
  ulong end;
  Index index;
  ulong end_00;
  
  pDVar1 = (kernel->
           super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
           ).m_dstExpr;
  pfVar2 = (pDVar1->
           super_BlockImpl<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_0>.m_data
  ;
  end = (pDVar1->super_BlockImpl<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_Eigen::Dense>).
        super_BlockImpl_dense<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_0>.m_rows.
        m_value;
  end_00 = end;
  if ((((ulong)pfVar2 & 3) == 0) &&
     (end_00 = (ulong)(-((uint)((ulong)pfVar2 >> 2) & 0x3fffffff) & 3), (long)end <= (long)end_00))
  {
    end_00 = end;
  }
  start = end_00 + ((long)(end - end_00) / 4) * 4;
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>>,Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>>,Eigen::internal::swap_assign_op<float>,0>>
            (kernel,0,end_00);
  for (; (long)end_00 < start; end_00 = end_00 + 4) {
    generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,-1,1,true>>,Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,-1,1,true>>,Eigen::internal::swap_assign_op<float>,0>
    ::assignPacket<16,0,float__vector(4)>(kernel,end_00);
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>>,Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>>,Eigen::internal::swap_assign_op<float>,0>>
            (kernel,start,end);
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    const Index size = kernel.size();
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      requestedAlignment = Kernel::AssignmentTraits::LinearRequiredAlignment,
      packetSize = unpacket_traits<PacketType>::size,
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = packet_traits<Scalar>::AlignedOnScalar ? int(requestedAlignment)
                                                            : int(Kernel::AssignmentTraits::DstAlignment),
      srcAlignment = Kernel::AssignmentTraits::JointAlignment
    };
    const Index alignedStart = dstIsAligned ? 0 : internal::first_aligned<requestedAlignment>(kernel.dstDataPtr(), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_dense_assignment_loop<dstIsAligned!=0>::run(kernel, 0, alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
      kernel.template assignPacket<dstAlignment, srcAlignment, PacketType>(index);

    unaligned_dense_assignment_loop<>::run(kernel, alignedEnd, size);
  }